

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_conversion.cc
# Opt level: O3

bool absl::lts_20250127::str_format_internal::anon_unknown_0::FloatToSink<double>
               (double v,FormatConversionSpecImpl *conv,FormatSinkImpl *sink)

{
  uint uVar1;
  undefined1 auVar2 [16];
  byte bVar3;
  undefined1 auVar4 [16];
  anon_unknown_0 *paVar5;
  string_view data_postfix;
  bool bVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  char *pcVar10;
  long lVar11;
  ulong uVar12;
  char *pcVar13;
  FormatConversionChar FVar14;
  char *pcVar15;
  size_t padding_offset;
  char *pcVar16;
  size_t sVar17;
  int iVar18;
  ulong uVar19;
  _anonymous_namespace_ *this;
  anon_unknown_0 *paVar20;
  anon_unknown_0 *this_00;
  ulong uVar21;
  int *exp;
  byte bVar22;
  ulong uVar23;
  char sign_char;
  ulong uVar24;
  ulong uVar25;
  size_t trailing_zeros;
  ulong uVar26;
  double dVar27;
  ulong in_XMM0_Qb;
  string_view value;
  Decomposed<double> decomposed;
  Decomposed<double> decomposed_00;
  string_view str;
  uint128 v_00;
  string_view data;
  char digits_buffer [20];
  Buffer buffer;
  Buffer *pBVar28;
  undefined4 in_stack_fffffffffffffeb0;
  uint exp_00;
  FormatState local_148;
  char local_128;
  byte local_127;
  char local_126;
  char local_125;
  char local_124 [28];
  double local_108;
  ulong uStack_100;
  double local_f8;
  Buffer local_e8;
  
  if ((long)v < 0) {
    dVar27 = -v;
    in_XMM0_Qb = in_XMM0_Qb ^ 0x8000000000000000;
    sign_char = '-';
LAB_00376e20:
    pBVar28 = (Buffer *)(local_e8.data + 1);
    local_e8.data[0] = sign_char;
  }
  else {
    sign_char = '+';
    dVar27 = v;
    if (((conv->flags_ & kShowPos) != kBasic) ||
       (sign_char = ' ', (conv->flags_ & kSignCol) != kBasic)) goto LAB_00376e20;
    pBVar28 = &local_e8;
    sign_char = '\0';
  }
  local_f8 = v;
  if (NAN(dVar27)) {
    FVar14 = conv->conv_;
    pcVar16 = "NAN";
    pcVar10 = "nan";
LAB_00376e6d:
    if ((FVar14 & ~x) == F) {
      pcVar10 = pcVar16;
    }
    if (FVar14 == X) {
      pcVar10 = pcVar16;
    }
    pBVar28->data[2] = pcVar10[2];
    *(undefined2 *)pBVar28->data = *(undefined2 *)pcVar10;
    value._M_len = (long)pBVar28 + (3 - (long)&local_e8);
    value._M_str = local_e8.data;
    local_108 = dVar27;
    uStack_100 = in_XMM0_Qb;
    bVar6 = FormatSinkImpl::PutPaddedString(sink,value,conv->width_,-1,(bool)(conv->flags_ & kLeft))
    ;
    dVar27 = local_108;
    if (bVar6) {
      return true;
    }
  }
  else if (ABS(dVar27) == INFINITY) {
    FVar14 = conv->conv_;
    pcVar16 = "INF";
    pcVar10 = "inf";
    goto LAB_00376e6d;
  }
  uVar25 = 6;
  if (-1 < conv->precision_) {
    uVar25 = (ulong)(uint)conv->precision_;
  }
  exp_00 = 0;
  pBVar28 = &local_e8;
  dVar27 = frexp(dVar27,(int *)pBVar28);
  dVar27 = ldexp(dVar27,0x35);
  FVar14 = conv->conv_;
  if (6 < (FVar14 & 0xfffffffe) - 8) {
    return false;
  }
  uVar1 = local_e8.data._0_4_ - 0x35;
  exp = (int *)(ulong)uVar1;
  this = (_anonymous_namespace_ *)
         ((long)(dVar27 - 9.223372036854776e+18) & (long)dVar27 >> 0x3f | (long)dVar27);
  local_148.sign_char = sign_char;
  local_148.precision = uVar25;
  local_148.conv = conv;
  local_148.sink = sink;
  switch(FVar14 & 0xfffffffe) {
  case 8:
    if ((int)local_e8.data._0_4_ < 0x35) {
      if (uVar1 < 0xffffff80) {
        FormatFNegativeExpSlow
                  ((anon_unknown_0 *)this,(uint128)(ZEXT416(0x35 - local_e8.data._0_4_) << 0x40),
                   (int)&local_148,(FormatState *)&switchD_00376f39::switchdataD_004a0e40);
        return true;
      }
      local_e8.data[0x2a] = '.';
      uVar12 = 0;
      pcVar10 = local_e8.data + 0x29;
      if (0xffffffc0 < uVar1) {
        uVar12 = (ulong)this >> ((byte)(0x35 - local_e8.data._0_4_) & 0x3f);
      }
      do {
        pcVar16 = pcVar10;
        *pcVar16 = (char)uVar12 + (char)(uVar12 / 10) * -10 | 0x30;
        pcVar10 = pcVar16 + -1;
        bVar6 = 9 < uVar12;
        uVar12 = uVar12 / 10;
      } while (bVar6);
      pcVar15 = local_e8.data + 0x2b;
      *pcVar10 = '0';
      if ((int)local_e8.data._0_4_ < -0xb) {
        auVar4._8_8_ = 0;
        auVar4._0_8_ = pcVar15;
        pcVar15 = PrintFractionalDigitsFast
                            ((anon_unknown_0 *)this,(uint128)(auVar4 << 0x40),
                             (char *)(ulong)(0x35 - local_e8.data._0_4_),(uint)uVar25,
                             0xcccccccccccccccd);
      }
      else {
        uVar12 = (long)this << (local_e8.data[0] + 0xbU & 0x3f);
        for (; uVar25 != 0; uVar25 = uVar25 - 1) {
          if (uVar12 == 0) goto LAB_00377538;
          auVar2._8_8_ = 0;
          auVar2._0_8_ = uVar12;
          uVar12 = SUB168(auVar2 * ZEXT816(10),0);
          *pcVar15 = SUB161(auVar2 * ZEXT816(10),8) | 0x30;
          pcVar15 = pcVar15 + 1;
        }
        pcVar13 = pcVar15;
        if ((long)uVar12 < 0) {
          while( true ) {
            do {
              pcVar13 = pcVar13 + -1;
              bVar22 = *pcVar13;
            } while (bVar22 == 0x2e);
            if (bVar22 != 0x39) break;
            *pcVar13 = 0x30;
          }
          *pcVar13 = bVar22 + 1;
        }
      }
LAB_00377538:
      if (*pcVar10 != '0') {
        pcVar16 = pcVar10;
      }
    }
    else {
      if (this == (_anonymous_namespace_ *)0x0) {
        uVar7 = 0x40;
      }
      else {
        lVar11 = 0x3f;
        if (this != (_anonymous_namespace_ *)0x0) {
          for (; (ulong)this >> lVar11 == 0; lVar11 = lVar11 + -1) {
          }
        }
        uVar7 = (uint)lVar11 ^ 0x3f;
      }
      iVar9 = (local_e8.data._0_4_ - uVar7) + 0xb;
      if (0x80 < iVar9) {
        FormatFPositiveExpSlow
                  ((anon_unknown_0 *)this,(uint128)(ZEXT416(uVar1) << 0x40),(int)&local_148,
                   (FormatState *)&switchD_00376f39::switchdataD_004a0e40);
        return true;
      }
      pcVar16 = local_e8.data + 0x2a;
      local_e8.data[0x2a] = '.';
      pcVar15 = local_e8.data + 0x2b;
      bVar22 = (byte)uVar1;
      if (iVar9 < 0x41) {
        uVar25 = (long)this << (bVar22 & 0x3f);
        do {
          pcVar16[-1] = (char)uVar25 + (char)(uVar25 / 10) * -10 | 0x30;
          pcVar16 = pcVar16 + -1;
          bVar6 = 9 < uVar25;
          uVar25 = uVar25 / 10;
        } while (bVar6);
      }
      else {
        paVar20 = (anon_unknown_0 *)((long)this << (bVar22 & 0x3f));
        this_00 = paVar20;
        paVar5 = (anon_unknown_0 *)(0L << (bVar22 & 0x3f) | (ulong)this >> 0x40 - (bVar22 & 0x3f));
        if ((uVar1 & 0x40) != 0) {
          this_00 = (anon_unknown_0 *)0x0;
          paVar5 = paVar20;
        }
        v_00.hi_ = (uint64_t)pcVar16;
        v_00.lo_ = (uint64_t)paVar5;
        pcVar16 = PrintIntegralDigitsFromRightFast(this_00,v_00,(char *)exp);
      }
    }
    sVar17 = (long)pcVar15 - (long)pcVar16;
    if ((local_148.precision == 0) && (((local_148.conv)->flags_ & kAlt) == kBasic)) {
      sVar17 = sVar17 - 1;
    }
    trailing_zeros = (long)&local_e8 + (local_148.precision - (long)pcVar15) + 0x2b;
    pBVar28 = (Buffer *)0x3b54fc;
    padding_offset = 0;
    goto LAB_00377580;
  case 10:
    decomposed_00._8_8_ = uVar25;
    decomposed_00.mantissa = (MantissaType)exp;
    bVar6 = str_format_internal::(anonymous_namespace)::
            FloatToBuffer<(absl::lts_20250127::str_format_internal::(anonymous_namespace)::FormatStyle)1,double>
                      (this,decomposed_00,(size_t)&local_e8,(Buffer *)&stack0xfffffffffffffeb4,exp);
    if (!bVar6) {
LAB_0037702c:
      bVar6 = FallbackToSnprintf<double>(local_f8,conv,sink);
      return bVar6;
    }
    if ((conv->flags_ & kAlt) == kBasic) {
      if (local_e8.end <= local_e8.begin) {
LAB_0037727c:
        __assert_fail("begin < end",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/str_format/float_conversion.cc"
                      ,0x3fc,
                      "char &absl::str_format_internal::(anonymous namespace)::Buffer::back() const"
                     );
      }
      if (local_e8.end[-1] == '.') {
        local_e8.end = local_e8.end + -1;
      }
    }
    break;
  case 0xc:
    uVar12 = 1;
    if (uVar25 != 0) {
      uVar12 = uVar25;
    }
    decomposed._8_8_ = uVar12 - 1;
    decomposed.mantissa = (MantissaType)exp;
    bVar6 = str_format_internal::(anonymous_namespace)::
            FloatToBuffer<(absl::lts_20250127::str_format_internal::(anonymous_namespace)::FormatStyle)1,double>
                      (this,decomposed,(size_t)&local_e8,(Buffer *)&stack0xfffffffffffffeb4,exp);
    if (!bVar6) goto LAB_0037702c;
    uVar25 = (ulong)(int)exp_00;
    if ((long)uVar25 < 0) {
      if (0xfffffffb < exp_00) {
        local_e8.begin[1] = *local_e8.begin;
        if (exp_00 != 0xffffffff) {
          iVar9 = exp_00 + 1;
          do {
            pcVar10 = local_e8.begin + -1;
            *local_e8.begin = '0';
            iVar9 = iVar9 + 1;
            local_e8.begin = pcVar10;
          } while (iVar9 != 0);
        }
        *local_e8.begin = '.';
        local_e8.begin[-1] = '0';
        exp_00 = 0;
        local_e8.begin = local_e8.begin + -1;
      }
    }
    else if (uVar25 < uVar12) {
      bVar6 = exp_00 != 0;
      exp_00 = 0;
      if (bVar6) {
        std::_V2::__rotate<char*>(local_e8.begin + 1,local_e8.begin + 2,local_e8.begin + uVar25 + 2)
        ;
        exp_00 = 0;
      }
    }
    pcVar10 = local_e8.end;
    if ((conv->flags_ & kAlt) == kBasic) {
      do {
        local_e8.end = pcVar10;
        if (local_e8.end <= local_e8.begin) goto LAB_0037727c;
        pcVar10 = local_e8.end + -1;
      } while (*pcVar10 == '0');
      if (*pcVar10 == '.') {
        local_e8.end = pcVar10;
      }
    }
    if (exp_00 == 0) goto LAB_003772d7;
    break;
  case 0xe:
    iVar9 = conv->precision_;
    iVar18 = local_e8.data._0_4_ + 0xb;
    if (0 < (long)this) {
      iVar8 = -0x3fe;
      if (iVar18 < -0x3fe) {
        iVar8 = iVar18;
      }
      do {
        if (iVar18 < -0x3fd) {
          uVar12 = (ulong)this >> (2U - (char)iVar8 & 0x3f);
          iVar8 = -0x3fe;
          uVar23 = 0;
          goto LAB_00377098;
        }
        this = (_anonymous_namespace_ *)((long)this * 2);
        iVar18 = iVar18 + -1;
      } while (0 < (long)this);
    }
    uVar23 = (ulong)this >> 0x3f;
    iVar8 = 0;
    if (this != (_anonymous_namespace_ *)0x0) {
      iVar8 = iVar18 + -1;
    }
    uVar12 = (long)this * 2;
LAB_00377098:
    bVar22 = (byte)uVar23;
    uVar21 = uVar12;
    if (-1 < iVar9) {
      uVar21 = 0;
      if (uVar25 < 0x11) {
        uVar21 = 0x10 - uVar25;
      }
      uVar19 = 0xffffffffffffffff;
      if ((uint)uVar25 < 0x10) {
        bVar3 = (char)uVar21 * '\x04';
        uVar19 = 0xffffffffffffffff >> ((char)uVar21 * -4 & 0x3fU);
        uVar26 = uVar12 & uVar19;
        uVar24 = 8L << (bVar3 - 4 & 0x3f);
        if (uVar26 == uVar24) {
          if (uVar21 != 0x10) {
            uVar23 = uVar12 >> (bVar3 & 0x3f) & 0xffffffff;
          }
          if ((uVar23 & 1) != 0) {
LAB_0037739b:
            lVar11 = 0;
            if (0xf >= uVar21) {
              lVar11 = 1L << (bVar3 & 0x3f);
            }
            bVar6 = (long)uVar12 < 0;
            uVar12 = uVar12 + lVar11;
            bVar22 = bVar22 + (-1 < (long)uVar12 && bVar6 || 0xf < uVar21);
          }
        }
        else if (uVar24 < uVar26) goto LAB_0037739b;
        uVar19 = ~uVar19;
      }
      uVar12 = uVar12 & uVar19;
      uVar21 = uVar25;
    }
    lVar11 = (ulong)(FVar14 != A) * 0x10;
    local_128 = '0';
    local_127 = (FVar14 != A) << 5 | 0x58;
    local_126 = "0123456789ABCDEF0123456789abcdef"[(ulong)bVar22 + lVar11];
    if ((uVar21 == 0) && ((conv->flags_ & kAlt) == kBasic)) {
      pcVar10 = &local_125;
    }
    else {
      pcVar10 = local_124;
      local_125 = '.';
    }
    uVar23 = 0;
    if (uVar12 != 0) {
      do {
        pcVar10[uVar23] = "0123456789ABCDEF0123456789abcdef"[(uVar12 >> 0x3c) + lVar11];
        uVar12 = uVar12 << 4;
        uVar23 = uVar23 + 1;
      } while (uVar12 != 0);
      pcVar10 = pcVar10 + uVar23;
    }
    if (iVar9 < 0) {
      trailing_zeros = 0;
    }
    else {
      trailing_zeros = uVar25 - uVar23;
      if (uVar25 < uVar23) {
        __assert_fail("state.precision >= digits_emitted",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/str_format/float_conversion.cc"
                      ,0x3a5,
                      "void absl::str_format_internal::(anonymous namespace)::FormatA(const HexFloatTypeParams, Int, int, bool, const FormatState &) [Int = unsigned long]"
                     );
      }
    }
    pcVar16 = &local_128;
    sVar17 = (long)pcVar10 - (long)pcVar16;
    local_e8.data._0_4_ =
         CONCAT22(local_e8.data._2_2_,CONCAT11((char)(iVar8 >> 0x1f) * -2 + '+',(FVar14 != A) << 5))
         | 0x50;
    iVar9 = -iVar8;
    if (0 < iVar8) {
      iVar9 = iVar8;
    }
    numbers_internal::FastIntToBuffer(iVar9,local_e8.data + 2);
    strlen(pBVar28->data);
    padding_offset = 2;
LAB_00377580:
    data_postfix._M_str._0_4_ = in_stack_fffffffffffffeb0;
    data_postfix._M_len = (size_t)pBVar28;
    data_postfix._M_str._4_4_ = exp_00;
    data._M_str = pcVar16;
    data._M_len = sVar17;
    FinalPrint(&local_148,data,padding_offset,trailing_zeros,data_postfix);
    return true;
  }
  bVar22 = 0x45;
  if (conv->conv_ != X) {
    bVar22 = ((conv->conv_ & ~x) != F) << 5 | 0x45;
  }
  PrintExponent(exp_00,bVar22,&local_e8);
LAB_003772d7:
  str._M_len = (long)local_e8.end - (long)local_e8.begin;
  str._M_str = local_e8.begin;
  WriteBufferToSink(sign_char,str,(FormatConversionSpecImpl *)(ulong)conv->flags_,
                    (FormatSinkImpl *)(ulong)(uint)conv->width_);
  return true;
}

Assistant:

bool FloatToSink(const Float v, const FormatConversionSpecImpl &conv,
                 FormatSinkImpl *sink) {
  // Print the sign or the sign column.
  Float abs_v = v;
  char sign_char = 0;
  if (std::signbit(abs_v)) {
    sign_char = '-';
    abs_v = -abs_v;
  } else if (conv.has_show_pos_flag()) {
    sign_char = '+';
  } else if (conv.has_sign_col_flag()) {
    sign_char = ' ';
  }

  // Print nan/inf.
  if (ConvertNonNumericFloats(sign_char, abs_v, conv, sink)) {
    return true;
  }

  size_t precision =
      conv.precision() < 0 ? 6 : static_cast<size_t>(conv.precision());

  int exp = 0;

  auto decomposed = Decompose(abs_v);

  Buffer buffer;

  FormatConversionChar c = conv.conversion_char();

  if (c == FormatConversionCharInternal::f ||
      c == FormatConversionCharInternal::F) {
    FormatF(decomposed.mantissa, decomposed.exponent,
            {sign_char, precision, conv, sink});
    return true;
  } else if (c == FormatConversionCharInternal::e ||
             c == FormatConversionCharInternal::E) {
    if (!FloatToBuffer<FormatStyle::Precision>(decomposed, precision, &buffer,
                                               &exp)) {
      return FallbackToSnprintf(v, conv, sink);
    }
    if (!conv.has_alt_flag() && buffer.back() == '.') buffer.pop_back();
    PrintExponent(
        exp, FormatConversionCharIsUpper(conv.conversion_char()) ? 'E' : 'e',
        &buffer);
  } else if (c == FormatConversionCharInternal::g ||
             c == FormatConversionCharInternal::G) {
    precision = std::max(precision, size_t{1}) - 1;
    if (!FloatToBuffer<FormatStyle::Precision>(decomposed, precision, &buffer,
                                               &exp)) {
      return FallbackToSnprintf(v, conv, sink);
    }
    if ((exp < 0 || precision + 1 > static_cast<size_t>(exp)) && exp >= -4) {
      if (exp < 0) {
        // Have 1.23456, needs 0.00123456
        // Move the first digit
        buffer.begin[1] = *buffer.begin;
        // Add some zeros
        for (; exp < -1; ++exp) *buffer.begin-- = '0';
        *buffer.begin-- = '.';
        *buffer.begin = '0';
      } else if (exp > 0) {
        // Have 1.23456, needs 1234.56
        // Move the '.' exp positions to the right.
        std::rotate(buffer.begin + 1, buffer.begin + 2, buffer.begin + exp + 2);
      }
      exp = 0;
    }
    if (!conv.has_alt_flag()) {
      while (buffer.back() == '0') buffer.pop_back();
      if (buffer.back() == '.') buffer.pop_back();
    }
    if (exp) {
      PrintExponent(
          exp, FormatConversionCharIsUpper(conv.conversion_char()) ? 'E' : 'e',
          &buffer);
    }
  } else if (c == FormatConversionCharInternal::a ||
             c == FormatConversionCharInternal::A) {
    bool uppercase = (c == FormatConversionCharInternal::A);
    FormatA(HexFloatTypeParams(Float{}), decomposed.mantissa,
            decomposed.exponent, uppercase, {sign_char, precision, conv, sink});
    return true;
  } else {
    return false;
  }

  WriteBufferToSink(
      sign_char,
      absl::string_view(buffer.begin,
                        static_cast<size_t>(buffer.end - buffer.begin)),
      conv, sink);

  return true;
}